

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O0

void __thiscall xcard::xcard(xcard *this,string *prefix,int debug)

{
  int debug_local;
  string *prefix_local;
  xcard *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->VERSION = 0.03;
  std::__cxx11::string::operator=((string *)this,(string *)prefix);
  this->debug = debug;
  return;
}

Assistant:

xcard::xcard(std::string prefix, int debug)
{
    this->prefix = prefix;
    this->debug = debug;
}